

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

tlc_string_t * __thiscall
TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_
          (tlc_string_t *__return_storage_ptr__,CLineCount *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_lasterrorstring)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_lasterrorstring)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

tlc_string_t CLineCount::lastErrorString() const
{
	return m_lasterrorstring;
}